

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_lite.h
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldLite<int,_proto2_unittest::TestAllTypesLite>::~MapFieldLite
          (MapFieldLite<int,_proto2_unittest::TestAllTypesLite> *this)

{
  Nullable<const_char_*> failure_msg;
  undefined1 local_38 [16];
  NodeBase **local_28;
  Arena *local_20;
  void *local_18;
  
  local_38._0_8_ = *(undefined8 *)((long)&this->field_0 + 0x18);
  local_18 = (void *)0x0;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::Arena*,decltype(nullptr)>
                          ((Arena **)local_38,&local_18,"map_.arena() == nullptr");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_20 = *(Arena **)((long)&this->field_0 + 0x18);
    local_38._0_8_ = (Arena *)0x100000000;
    local_38._8_8_ =
         (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          )0x6110035800000001;
    local_28 = (NodeBase **)&kGlobalEmptyTable;
    UntypedMapBase::InternalSwap((UntypedMapBase *)this,(UntypedMapBase *)local_38);
    Map<int,_proto2_unittest::TestAllTypesLite>::~Map
              ((Map<int,_proto2_unittest::TestAllTypesLite> *)local_38);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field_lite.h"
             ,0x37,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_38);
}

Assistant:

~MapFieldLite() {
    ABSL_DCHECK_EQ(map_.arena(), nullptr);
    // We want to destruct the map in such a way that we can verify
    // that we've done that, but also be sure that we've deallocated
    // everything (as opposed to leaving an allocation behind with no
    // data in it, as would happen if a vector was resize'd to zero.
    // Map::Swap with an empty map accomplishes that.
    decltype(map_) swapped_map(map_.arena());
    map_.InternalSwap(&swapped_map);
  }